

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_messenger.cpp
# Opt level: O3

void __thiscall cppcms::impl::messenger::messenger(messenger *this,string *ip,int port)

{
  pointer pcVar1;
  socklen_t in_ECX;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  booster::aio::stream_socket::stream_socket(&this->socket_);
  (this->ip_)._M_dataplus._M_p = (pointer)&(this->ip_).field_2;
  (this->ip_)._M_string_length = 0;
  (this->ip_).field_2._M_local_buf[0] = '\0';
  pcVar1 = (ip->_M_dataplus)._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>((string *)local_50,pcVar1,pcVar1 + ip->_M_string_length)
  ;
  connect(this,(int)local_50,(sockaddr *)(ulong)(uint)port,in_ECX);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  return;
}

Assistant:

messenger::messenger(std::string ip,int port) :
		socket_()
{
	connect(ip,port);
}